

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Ref<embree::Geometry> *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined1 (*pauVar27) [12];
  undefined8 uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  byte bVar31;
  int iVar32;
  uint uVar33;
  size_t i;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar71;
  float fVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar73;
  undefined1 auVar70 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined4 uStack_2774;
  undefined4 uStack_2770;
  undefined4 uStack_276c;
  undefined4 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2740;
  undefined8 uStack_2738;
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  undefined4 uStack_26c4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined1 local_2660 [32];
  undefined4 local_2640;
  undefined4 uStack_263c;
  undefined4 uStack_2638;
  undefined4 uStack_2634;
  undefined4 uStack_2630;
  undefined4 uStack_262c;
  undefined4 uStack_2628;
  undefined4 uStack_2624;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  undefined4 uStack_23c4;
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar34;
  float fVar79;
  float fVar83;
  float fVar84;
  
  pauVar38 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar48._4_4_ = fVar1;
  auVar48._0_4_ = fVar1;
  auVar48._8_4_ = fVar1;
  auVar48._12_4_ = fVar1;
  auVar48._16_4_ = fVar1;
  auVar48._20_4_ = fVar1;
  auVar48._24_4_ = fVar1;
  auVar48._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar49._4_4_ = fVar2;
  auVar49._0_4_ = fVar2;
  auVar49._8_4_ = fVar2;
  auVar49._12_4_ = fVar2;
  auVar49._16_4_ = fVar2;
  auVar49._20_4_ = fVar2;
  auVar49._24_4_ = fVar2;
  auVar49._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  auVar50._16_4_ = fVar3;
  auVar50._20_4_ = fVar3;
  auVar50._24_4_ = fVar3;
  auVar50._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar32 = (tray->tfar).field_0.i[k];
  auVar87 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32,CONCAT412(
                                                  iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32)))))
                                               )));
  auVar54._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar54._8_4_ = -fVar1;
  auVar54._12_4_ = -fVar1;
  auVar54._16_4_ = -fVar1;
  auVar54._20_4_ = -fVar1;
  auVar54._24_4_ = -fVar1;
  auVar54._28_4_ = -fVar1;
  auVar55._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar55._8_4_ = -fVar2;
  auVar55._12_4_ = -fVar2;
  auVar55._16_4_ = -fVar2;
  auVar55._20_4_ = -fVar2;
  auVar55._24_4_ = -fVar2;
  auVar55._28_4_ = -fVar2;
  iVar32 = (tray->tnear).field_0.i[k];
  auVar89._4_4_ = iVar32;
  auVar89._0_4_ = iVar32;
  auVar89._8_4_ = iVar32;
  auVar89._12_4_ = iVar32;
  auVar89._16_4_ = iVar32;
  auVar89._20_4_ = iVar32;
  auVar89._24_4_ = iVar32;
  auVar89._28_4_ = iVar32;
  local_2660._16_16_ = mm_lookupmask_ps._240_16_;
  local_2660._0_16_ = mm_lookupmask_ps._0_16_;
  local_2640 = 0x80000000;
  uStack_263c = 0x80000000;
  uStack_2638 = 0x80000000;
  uStack_2634 = 0x80000000;
  uStack_2630 = 0x80000000;
  uStack_262c = 0x80000000;
  uStack_2628 = 0x80000000;
  uStack_2624 = 0x80000000;
  auVar65._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar3;
  auVar65._12_4_ = -fVar3;
  auVar65._16_4_ = -fVar3;
  auVar65._20_4_ = -fVar3;
  auVar65._24_4_ = -fVar3;
  auVar65._28_4_ = -fVar3;
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = 0x3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  auVar60._16_4_ = 0x3f800000;
  auVar60._20_4_ = 0x3f800000;
  auVar60._24_4_ = 0x3f800000;
  auVar60._28_4_ = 0x3f800000;
  auVar86._8_4_ = 0xbf800000;
  auVar86._0_8_ = 0xbf800000bf800000;
  auVar86._12_4_ = 0xbf800000;
  auVar86._16_4_ = 0xbf800000;
  auVar86._20_4_ = 0xbf800000;
  auVar86._24_4_ = 0xbf800000;
  auVar86._28_4_ = 0xbf800000;
  _local_2680 = vblendvps_avx(auVar60,auVar86,local_2660);
LAB_0166df0c:
  do {
    do {
      if (pauVar38 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar36 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar36 + 8));
    uVar46 = *(ulong *)*pauVar38;
    while ((uVar46 & 8) == 0) {
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar37),auVar54,auVar48);
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar39),auVar55,auVar49);
      auVar86 = vpmaxsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar59));
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar40),auVar65,auVar50);
      auVar60 = vpmaxsd_avx2(ZEXT1632(auVar51),auVar89);
      local_2580 = vpmaxsd_avx2(auVar86,auVar60);
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar37 ^ 0x20)),auVar54,
                                auVar48);
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar39 ^ 0x20)),auVar55,
                                auVar49);
      auVar86 = vpminsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar59));
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar40 ^ 0x20)),auVar65,
                                auVar50);
      auVar60 = vpminsd_avx2(ZEXT1632(auVar51),auVar87._0_32_);
      auVar86 = vpminsd_avx2(auVar86,auVar60);
      auVar86 = vpcmpgtd_avx2(local_2580,auVar86);
      iVar32 = vmovmskps_avx(auVar86);
      if (iVar32 == 0xff) goto LAB_0166df0c;
      bVar31 = ~(byte)iVar32;
      uVar41 = uVar46 & 0xfffffffffffffff0;
      lVar47 = 0;
      for (uVar46 = (ulong)bVar31; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
        lVar47 = lVar47 + 1;
      }
      uVar46 = *(ulong *)(uVar41 + lVar47 * 8);
      uVar33 = bVar31 - 1 & (uint)bVar31;
      uVar34 = (ulong)uVar33;
      if (uVar33 != 0) {
        uVar43 = *(uint *)(local_2580 + lVar47 * 4);
        lVar47 = 0;
        for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar47 = lVar47 + 1;
        }
        uVar33 = uVar33 - 1 & uVar33;
        uVar35 = (ulong)uVar33;
        uVar34 = *(ulong *)(uVar41 + lVar47 * 8);
        uVar44 = *(uint *)(local_2580 + lVar47 * 4);
        if (uVar33 == 0) {
          if (uVar43 < uVar44) {
            *(ulong *)*pauVar38 = uVar34;
            *(uint *)(*pauVar38 + 8) = uVar44;
            pauVar38 = pauVar38 + 1;
          }
          else {
            *(ulong *)*pauVar38 = uVar46;
            *(uint *)(*pauVar38 + 8) = uVar43;
            pauVar38 = pauVar38 + 1;
            uVar46 = uVar34;
          }
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar46;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar43));
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar34;
          auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar44));
          lVar47 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar47 = lVar47 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar46 = (ulong)uVar33;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(uVar41 + lVar47 * 8);
          auVar52 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_2580 + lVar47 * 4)));
          auVar67 = vpcmpgtd_avx(auVar59,auVar51);
          if (uVar33 == 0) {
            auVar75 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar59,auVar51,auVar75);
            auVar51 = vblendvps_avx(auVar51,auVar59,auVar75);
            auVar59 = vpcmpgtd_avx(auVar52,auVar67);
            auVar75 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar52,auVar67,auVar75);
            auVar67 = vblendvps_avx(auVar67,auVar52,auVar75);
            auVar52 = vpcmpgtd_avx(auVar67,auVar51);
            auVar75 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar67,auVar51,auVar75);
            auVar51 = vblendvps_avx(auVar51,auVar67,auVar75);
            *pauVar38 = auVar51;
            pauVar38[1] = auVar52;
            uVar46 = auVar59._0_8_;
            pauVar38 = pauVar38 + 2;
          }
          else {
            lVar47 = 0;
            for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar47 = lVar47 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar46 = (ulong)uVar33;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(uVar41 + lVar47 * 8);
            auVar75 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_2580 + lVar47 * 4)));
            if (uVar33 == 0) {
              auVar7 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar59,auVar51,auVar7);
              auVar51 = vblendvps_avx(auVar51,auVar59,auVar7);
              auVar59 = vpcmpgtd_avx(auVar75,auVar52);
              auVar7 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar75,auVar52,auVar7);
              auVar52 = vblendvps_avx(auVar52,auVar75,auVar7);
              auVar75 = vpcmpgtd_avx(auVar52,auVar51);
              auVar7 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar52,auVar51,auVar7);
              auVar51 = vblendvps_avx(auVar51,auVar52,auVar7);
              auVar52 = vpcmpgtd_avx(auVar59,auVar67);
              auVar7 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar59,auVar67,auVar7);
              auVar59 = vblendvps_avx(auVar67,auVar59,auVar7);
              auVar67 = vpcmpgtd_avx(auVar75,auVar59);
              auVar7 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar75,auVar59,auVar7);
              auVar59 = vblendvps_avx(auVar59,auVar75,auVar7);
              *pauVar38 = auVar51;
              pauVar38[1] = auVar59;
              pauVar38[2] = auVar67;
              uVar46 = auVar52._0_8_;
              pauVar38 = pauVar38 + 3;
            }
            else {
              *pauVar38 = auVar51;
              pauVar38[1] = auVar59;
              pauVar38[2] = auVar52;
              pauVar36 = pauVar38 + 3;
              pauVar38[3] = auVar75;
              do {
                lVar47 = 0;
                for (uVar34 = uVar46; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar47 = lVar47 + 1;
                }
                auVar52._8_8_ = 0;
                auVar52._0_8_ = *(ulong *)(uVar41 + lVar47 * 8);
                auVar51 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_2580 + lVar47 * 4)));
                pauVar36[1] = auVar51;
                pauVar36 = pauVar36 + 1;
                uVar46 = uVar46 - 1 & uVar46;
              } while (uVar46 != 0);
              lVar47 = 0;
              while (pauVar36 != pauVar38) {
                auVar51 = pauVar38[1];
                uVar33 = vextractps_avx(auVar51,2);
                for (lVar42 = 0x10;
                    (lVar47 != lVar42 && (*(uint *)(pauVar38[-1] + lVar42 + 8) < uVar33));
                    lVar42 = lVar42 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar38 + lVar42) =
                       *(undefined1 (*) [16])(pauVar38[-1] + lVar42);
                }
                *(undefined1 (*) [16])(*pauVar38 + lVar42) = auVar51;
                lVar47 = lVar47 + -0x10;
                pauVar38 = pauVar38 + 1;
              }
              uVar46 = *(ulong *)*pauVar36;
              pauVar38 = pauVar36;
            }
          }
        }
      }
    }
    uVar41 = uVar46 & 0xfffffffffffffff0;
    for (lVar47 = 0; lVar47 != (ulong)((uint)uVar46 & 0xf) - 8; lVar47 = lVar47 + 1) {
      lVar45 = lVar47 * 0xe0;
      lVar42 = uVar41 + 0xd0 + lVar45;
      local_25c0 = *(undefined8 *)(lVar42 + 0x10);
      uStack_25b8 = *(undefined8 *)(lVar42 + 0x18);
      lVar42 = uVar41 + 0xc0 + lVar45;
      local_25a0 = *(undefined8 *)(lVar42 + 0x10);
      uStack_2598 = *(undefined8 *)(lVar42 + 0x18);
      uStack_2590 = local_25a0;
      uStack_2588 = uStack_2598;
      uStack_25b0 = local_25c0;
      uStack_25a8 = uStack_25b8;
      auVar68._16_16_ = *(undefined1 (*) [16])(uVar41 + 0x60 + lVar45);
      auVar68._0_16_ = *(undefined1 (*) [16])(uVar41 + lVar45);
      auVar51 = *(undefined1 (*) [16])(uVar41 + 0x70 + lVar45);
      auVar74._16_16_ = auVar51;
      auVar74._0_16_ = *(undefined1 (*) [16])(uVar41 + 0x10 + lVar45);
      auVar80._16_16_ = *(undefined1 (*) [16])(uVar41 + 0x80 + lVar45);
      auVar80._0_16_ = *(undefined1 (*) [16])(uVar41 + 0x20 + lVar45);
      auVar59 = *(undefined1 (*) [16])(uVar41 + 0x30 + lVar45);
      auVar53._16_16_ = auVar59;
      auVar53._0_16_ = auVar59;
      auVar59 = *(undefined1 (*) [16])(uVar41 + 0x40 + lVar45);
      auVar76._16_16_ = auVar59;
      auVar76._0_16_ = auVar59;
      auVar59 = *(undefined1 (*) [16])(uVar41 + 0x50 + lVar45);
      auVar61._16_16_ = auVar59;
      auVar61._0_16_ = auVar59;
      auVar59 = *(undefined1 (*) [16])(uVar41 + 0x90 + lVar45);
      auVar88._16_16_ = auVar59;
      auVar88._0_16_ = auVar59;
      auVar67 = *(undefined1 (*) [16])(uVar41 + 0xa0 + lVar45);
      auVar56._16_16_ = auVar67;
      auVar56._0_16_ = auVar67;
      lVar45 = uVar41 + 0xb0 + lVar45;
      pauVar27 = (undefined1 (*) [12])(lVar45 + 0x10);
      uVar26 = *(undefined8 *)*pauVar27;
      uVar28 = *(undefined8 *)(lVar45 + 0x18);
      uStack_2774 = (undefined4)((ulong)uVar28 >> 0x20);
      uStack_2770 = (undefined4)uVar26;
      uStack_276c = (undefined4)((ulong)uVar26 >> 0x20);
      uStack_2768 = (undefined4)uVar28;
      auVar60 = vsubps_avx(auVar68,auVar53);
      auVar86 = vsubps_avx(auVar74,auVar76);
      auVar8 = vsubps_avx(auVar80,auVar61);
      auVar9 = vsubps_avx(auVar88,auVar68);
      auVar10 = vsubps_avx(auVar56,auVar74);
      auVar14._12_4_ = uStack_2774;
      auVar14._0_12_ = *pauVar27;
      auVar14._16_4_ = uStack_2770;
      auVar14._20_4_ = uStack_276c;
      auVar14._24_4_ = uStack_2768;
      auVar14._28_4_ = uStack_2774;
      auVar11 = vsubps_avx(auVar14,auVar80);
      auVar12._4_4_ = auVar11._4_4_ * auVar86._4_4_;
      auVar12._0_4_ = auVar11._0_4_ * auVar86._0_4_;
      auVar12._8_4_ = auVar11._8_4_ * auVar86._8_4_;
      auVar12._12_4_ = auVar11._12_4_ * auVar86._12_4_;
      auVar12._16_4_ = auVar11._16_4_ * auVar86._16_4_;
      auVar12._20_4_ = auVar11._20_4_ * auVar86._20_4_;
      auVar12._24_4_ = auVar11._24_4_ * auVar86._24_4_;
      auVar12._28_4_ = auVar11._28_4_;
      auVar52 = vfmsub231ps_fma(auVar12,auVar10,auVar8);
      local_2500 = ZEXT1632(auVar52);
      uVar4 = *(undefined4 *)(ray + k * 4);
      auVar85._4_4_ = uVar4;
      auVar85._0_4_ = uVar4;
      auVar85._8_4_ = uVar4;
      auVar85._12_4_ = uVar4;
      auVar85._16_4_ = uVar4;
      auVar85._20_4_ = uVar4;
      auVar85._24_4_ = uVar4;
      auVar85._28_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar57._4_4_ = uVar4;
      auVar57._0_4_ = uVar4;
      auVar57._8_4_ = uVar4;
      auVar57._12_4_ = uVar4;
      auVar57._16_4_ = uVar4;
      auVar57._20_4_ = uVar4;
      auVar57._24_4_ = uVar4;
      auVar57._28_4_ = uVar4;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar13._4_4_ = auVar8._4_4_ * auVar9._4_4_;
      auVar13._0_4_ = auVar8._0_4_ * auVar9._0_4_;
      auVar13._8_4_ = auVar8._8_4_ * auVar9._8_4_;
      auVar13._12_4_ = auVar8._12_4_ * auVar9._12_4_;
      auVar13._16_4_ = auVar8._16_4_ * auVar9._16_4_;
      auVar13._20_4_ = auVar8._20_4_ * auVar9._20_4_;
      auVar13._24_4_ = auVar8._24_4_ * auVar9._24_4_;
      auVar13._28_4_ = auVar59._12_4_;
      auVar12 = vsubps_avx(auVar68,auVar85);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar77._4_4_ = fVar2;
      auVar77._0_4_ = fVar2;
      auVar77._8_4_ = fVar2;
      auVar77._12_4_ = fVar2;
      auVar77._16_4_ = fVar2;
      auVar77._20_4_ = fVar2;
      auVar77._24_4_ = fVar2;
      auVar77._28_4_ = fVar2;
      auVar75 = vfmsub231ps_fma(auVar13,auVar11,auVar60);
      auVar13 = vsubps_avx(auVar74,auVar57);
      fVar3 = *(float *)(ray + k * 4 + 0x60);
      auVar58._4_4_ = fVar3;
      auVar58._0_4_ = fVar3;
      auVar58._8_4_ = fVar3;
      auVar58._12_4_ = fVar3;
      auVar58._16_4_ = fVar3;
      auVar58._20_4_ = fVar3;
      auVar58._24_4_ = fVar3;
      auVar58._28_4_ = fVar3;
      auVar30._4_4_ = uVar4;
      auVar30._0_4_ = uVar4;
      auVar30._8_4_ = uVar4;
      auVar30._12_4_ = uVar4;
      auVar30._16_4_ = uVar4;
      auVar30._20_4_ = uVar4;
      auVar30._24_4_ = uVar4;
      auVar30._28_4_ = uVar4;
      auVar14 = vsubps_avx(auVar80,auVar30);
      auVar29._4_4_ = fVar1;
      auVar29._0_4_ = fVar1;
      auVar29._8_4_ = fVar1;
      auVar29._12_4_ = fVar1;
      auVar29._16_4_ = fVar1;
      auVar29._20_4_ = fVar1;
      auVar29._24_4_ = fVar1;
      auVar29._28_4_ = fVar1;
      auVar18._4_4_ = fVar1 * auVar13._4_4_;
      auVar18._0_4_ = fVar1 * auVar13._0_4_;
      auVar18._8_4_ = fVar1 * auVar13._8_4_;
      auVar18._12_4_ = fVar1 * auVar13._12_4_;
      auVar18._16_4_ = fVar1 * auVar13._16_4_;
      auVar18._20_4_ = fVar1 * auVar13._20_4_;
      auVar18._24_4_ = fVar1 * auVar13._24_4_;
      auVar18._28_4_ = auVar13._28_4_;
      auVar59 = vfmsub231ps_fma(auVar18,auVar12,auVar77);
      auVar19._4_4_ = auVar11._4_4_ * auVar59._4_4_;
      auVar19._0_4_ = auVar11._0_4_ * auVar59._0_4_;
      auVar19._8_4_ = auVar11._8_4_ * auVar59._8_4_;
      auVar19._12_4_ = auVar11._12_4_ * auVar59._12_4_;
      auVar19._16_4_ = auVar11._16_4_ * 0.0;
      auVar19._20_4_ = auVar11._20_4_ * 0.0;
      auVar19._24_4_ = auVar11._24_4_ * 0.0;
      auVar19._28_4_ = auVar51._12_4_;
      auVar62._0_4_ = auVar59._0_4_ * auVar8._0_4_;
      auVar62._4_4_ = auVar59._4_4_ * auVar8._4_4_;
      auVar62._8_4_ = auVar59._8_4_ * auVar8._8_4_;
      auVar62._12_4_ = auVar59._12_4_ * auVar8._12_4_;
      auVar62._16_4_ = auVar8._16_4_ * 0.0;
      auVar62._20_4_ = auVar8._20_4_ * 0.0;
      auVar62._24_4_ = auVar8._24_4_ * 0.0;
      auVar62._28_4_ = 0;
      auVar8._4_4_ = auVar12._4_4_ * fVar3;
      auVar8._0_4_ = auVar12._0_4_ * fVar3;
      auVar8._8_4_ = auVar12._8_4_ * fVar3;
      auVar8._12_4_ = auVar12._12_4_ * fVar3;
      auVar8._16_4_ = auVar12._16_4_ * fVar3;
      auVar8._20_4_ = auVar12._20_4_ * fVar3;
      auVar8._24_4_ = auVar12._24_4_ * fVar3;
      auVar8._28_4_ = fVar2;
      auVar59 = vfmsub231ps_fma(auVar8,auVar14,auVar29);
      auVar51 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar59),auVar10);
      auVar59 = vfmadd231ps_fma(auVar62,auVar86,ZEXT1632(auVar59));
      local_27a0 = auVar60._0_4_;
      fStack_279c = auVar60._4_4_;
      fStack_2798 = auVar60._8_4_;
      fStack_2794 = auVar60._12_4_;
      fStack_2790 = auVar60._16_4_;
      fStack_278c = auVar60._20_4_;
      fStack_2788 = auVar60._24_4_;
      auVar11._4_4_ = auVar10._4_4_ * fStack_279c;
      auVar11._0_4_ = auVar10._0_4_ * local_27a0;
      auVar11._8_4_ = auVar10._8_4_ * fStack_2798;
      auVar11._12_4_ = auVar10._12_4_ * fStack_2794;
      auVar11._16_4_ = auVar10._16_4_ * fStack_2790;
      auVar11._20_4_ = auVar10._20_4_ * fStack_278c;
      auVar11._24_4_ = auVar10._24_4_ * fStack_2788;
      auVar11._28_4_ = auVar10._28_4_;
      auVar7 = vfmsub231ps_fma(auVar11,auVar9,auVar86);
      auVar78._0_4_ = auVar14._0_4_ * fVar2;
      auVar78._4_4_ = auVar14._4_4_ * fVar2;
      auVar78._8_4_ = auVar14._8_4_ * fVar2;
      auVar78._12_4_ = auVar14._12_4_ * fVar2;
      auVar78._16_4_ = auVar14._16_4_ * fVar2;
      auVar78._20_4_ = auVar14._20_4_ * fVar2;
      auVar78._24_4_ = auVar14._24_4_ * fVar2;
      auVar78._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar78,auVar58,auVar13);
      fVar79 = auVar7._0_4_;
      auVar81._0_4_ = fVar79 * fVar3;
      fVar83 = auVar7._4_4_;
      auVar81._4_4_ = fVar83 * fVar3;
      fVar84 = auVar7._8_4_;
      fVar20 = auVar7._12_4_;
      auVar81._8_4_ = fVar84 * fVar3;
      auVar81._12_4_ = fVar20 * fVar3;
      auVar81._16_4_ = fVar3 * 0.0;
      auVar81._20_4_ = fVar3 * 0.0;
      auVar81._24_4_ = fVar3 * 0.0;
      auVar81._28_4_ = 0;
      auVar67 = vfmadd231ps_fma(auVar81,ZEXT1632(auVar75),auVar77);
      auVar10._4_4_ = fVar1;
      auVar10._0_4_ = fVar1;
      auVar10._8_4_ = fVar1;
      auVar10._12_4_ = fVar1;
      auVar10._16_4_ = fVar1;
      auVar10._20_4_ = fVar1;
      auVar10._24_4_ = fVar1;
      auVar10._28_4_ = fVar1;
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),local_2500,auVar10);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar17),auVar9);
      auVar9._4_4_ = uStack_263c;
      auVar9._0_4_ = local_2640;
      auVar9._8_4_ = uStack_2638;
      auVar9._12_4_ = uStack_2634;
      auVar9._16_4_ = uStack_2630;
      auVar9._20_4_ = uStack_262c;
      auVar9._24_4_ = uStack_2628;
      auVar9._28_4_ = uStack_2624;
      auVar86 = vandps_avx(ZEXT1632(auVar67),auVar9);
      uVar33 = auVar86._0_4_;
      local_2580._0_4_ = (float)(auVar51._0_4_ ^ uVar33);
      uVar43 = auVar86._4_4_;
      local_2580._4_4_ = (float)(auVar51._4_4_ ^ uVar43);
      uVar44 = auVar86._8_4_;
      local_2580._8_4_ = (float)(auVar51._8_4_ ^ uVar44);
      uVar15 = auVar86._12_4_;
      local_2580._12_4_ = (float)(auVar51._12_4_ ^ uVar15);
      fVar1 = auVar86._16_4_;
      local_2580._16_4_ = fVar1;
      fVar2 = auVar86._20_4_;
      local_2580._20_4_ = fVar2;
      fVar3 = auVar86._24_4_;
      local_2580._24_4_ = fVar3;
      fVar16 = auVar86._28_4_;
      local_2580._28_4_ = fVar16;
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar17),auVar60);
      local_2560._0_4_ = (float)(uVar33 ^ auVar51._0_4_);
      local_2560._4_4_ = (float)(uVar43 ^ auVar51._4_4_);
      local_2560._8_4_ = (float)(uVar44 ^ auVar51._8_4_);
      local_2560._12_4_ = (float)(uVar15 ^ auVar51._12_4_);
      local_2560._16_4_ = fVar1;
      local_2560._20_4_ = fVar2;
      local_2560._24_4_ = fVar3;
      local_2560._28_4_ = fVar16;
      auVar86 = vcmpps_avx(local_2580,ZEXT832(0) << 0x20,5);
      auVar60 = vcmpps_avx(local_2560,ZEXT832(0) << 0x20,5);
      auVar86 = vandps_avx(auVar60,auVar86);
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69._16_4_ = 0x7fffffff;
      auVar69._20_4_ = 0x7fffffff;
      auVar69._24_4_ = 0x7fffffff;
      auVar69._28_4_ = 0x7fffffff;
      local_2520 = vandps_avx(ZEXT1632(auVar67),auVar69);
      auVar60 = vcmpps_avx(ZEXT1632(auVar67),ZEXT832(0) << 0x20,4);
      auVar86 = vandps_avx(auVar60,auVar86);
      auVar82._0_4_ = local_2580._0_4_ + local_2560._0_4_;
      auVar82._4_4_ = local_2580._4_4_ + local_2560._4_4_;
      auVar82._8_4_ = local_2580._8_4_ + local_2560._8_4_;
      auVar82._12_4_ = local_2580._12_4_ + local_2560._12_4_;
      auVar82._16_4_ = fVar1 + fVar1;
      auVar82._20_4_ = fVar2 + fVar2;
      auVar82._24_4_ = fVar3 + fVar3;
      auVar82._28_4_ = fVar16 + fVar16;
      auVar60 = vcmpps_avx(auVar82,local_2520,2);
      auVar8 = auVar60 & auVar86;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar86 = vandps_avx(auVar60,auVar86);
        auVar51 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
        uStack_26c4 = auVar14._28_4_;
        auVar21._4_4_ = auVar14._4_4_ * fVar83;
        auVar21._0_4_ = auVar14._0_4_ * fVar79;
        auVar21._8_4_ = auVar14._8_4_ * fVar84;
        auVar21._12_4_ = auVar14._12_4_ * fVar20;
        auVar21._16_4_ = auVar14._16_4_ * 0.0;
        auVar21._20_4_ = auVar14._20_4_ * 0.0;
        auVar21._24_4_ = auVar14._24_4_ * 0.0;
        auVar21._28_4_ = uStack_26c4;
        auVar59 = vfmadd132ps_fma(auVar13,auVar21,ZEXT1632(auVar75));
        auVar59 = vfmadd213ps_fma(auVar12,local_2500,ZEXT1632(auVar59));
        local_2540._0_4_ = (float)(auVar59._0_4_ ^ uVar33);
        local_2540._4_4_ = (float)(auVar59._4_4_ ^ uVar43);
        local_2540._8_4_ = (float)(auVar59._8_4_ ^ uVar44);
        local_2540._12_4_ = (float)(auVar59._12_4_ ^ uVar15);
        local_2540._16_4_ = fVar1;
        local_2540._20_4_ = fVar2;
        local_2540._24_4_ = fVar3;
        local_2540._28_4_ = fVar16;
        fVar66 = *(float *)(ray + k * 4 + 0x30);
        auVar22._4_4_ = local_2520._4_4_ * fVar66;
        auVar22._0_4_ = local_2520._0_4_ * fVar66;
        auVar22._8_4_ = local_2520._8_4_ * fVar66;
        auVar22._12_4_ = local_2520._12_4_ * fVar66;
        auVar22._16_4_ = local_2520._16_4_ * fVar66;
        auVar22._20_4_ = local_2520._20_4_ * fVar66;
        auVar22._24_4_ = local_2520._24_4_ * fVar66;
        auVar22._28_4_ = fVar66;
        auVar86 = vcmpps_avx(auVar22,local_2540,1);
        fVar66 = *(float *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = local_2520._4_4_ * fVar66;
        auVar23._0_4_ = local_2520._0_4_ * fVar66;
        auVar23._8_4_ = local_2520._8_4_ * fVar66;
        auVar23._12_4_ = local_2520._12_4_ * fVar66;
        auVar23._16_4_ = local_2520._16_4_ * fVar66;
        auVar23._20_4_ = local_2520._20_4_ * fVar66;
        auVar23._24_4_ = local_2520._24_4_ * fVar66;
        auVar23._28_4_ = fVar66;
        auVar60 = vcmpps_avx(local_2540,auVar23,2);
        auVar86 = vandps_avx(auVar60,auVar86);
        auVar59 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
        auVar51 = vpand_avx(auVar59,auVar51);
        auVar86 = vpmovzxwd_avx2(auVar51);
        auVar86 = vpslld_avx2(auVar86,0x1f);
        if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar86 >> 0x7f,0) != '\0') ||
              (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar86 >> 0xbf,0) != '\0') ||
            (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar86[0x1f] < '\0') {
          local_26a0 = vpsrad_avx2(auVar86,0x1f);
          local_2740 = auVar75._0_8_;
          uStack_2738 = auVar75._8_8_;
          local_24e0 = local_2740;
          uStack_24d8 = uStack_2738;
          uStack_24d0 = 0;
          uStack_24c8 = 0;
          local_2760 = auVar7._0_8_;
          uStack_2758 = auVar7._8_8_;
          local_24c0 = local_2760;
          uStack_24b8 = uStack_2758;
          uStack_24b0 = 0;
          uStack_24a8 = 0;
          local_24a0 = local_26a0;
          local_23c0 = local_2660;
          auVar60 = vrcpps_avx(local_2520);
          auVar63._8_4_ = 0x3f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar63._12_4_ = 0x3f800000;
          auVar63._16_4_ = 0x3f800000;
          auVar63._20_4_ = 0x3f800000;
          auVar63._24_4_ = 0x3f800000;
          auVar63._28_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_fma(local_2520,auVar60,auVar63);
          auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar60,auVar60);
          fVar66 = auVar59._0_4_;
          fVar71 = auVar59._4_4_;
          auVar24._4_4_ = fVar71 * local_2540._4_4_;
          auVar24._0_4_ = fVar66 * local_2540._0_4_;
          fVar72 = auVar59._8_4_;
          auVar24._8_4_ = fVar72 * local_2540._8_4_;
          fVar73 = auVar59._12_4_;
          auVar24._12_4_ = fVar73 * local_2540._12_4_;
          auVar24._16_4_ = fVar1 * 0.0;
          auVar24._20_4_ = fVar2 * 0.0;
          auVar24._24_4_ = fVar3 * 0.0;
          auVar24._28_4_ = fVar16;
          local_2440 = auVar24;
          auVar25._4_4_ = fVar71 * local_2580._4_4_;
          auVar25._0_4_ = fVar66 * local_2580._0_4_;
          auVar25._8_4_ = fVar72 * local_2580._8_4_;
          auVar25._12_4_ = fVar73 * local_2580._12_4_;
          auVar25._16_4_ = fVar1 * 0.0;
          auVar25._20_4_ = fVar2 * 0.0;
          auVar25._24_4_ = fVar3 * 0.0;
          auVar25._28_4_ = fVar16;
          auVar60 = vminps_avx(auVar25,auVar63);
          auVar70._0_4_ = fVar66 * local_2560._0_4_;
          auVar70._4_4_ = fVar71 * local_2560._4_4_;
          auVar70._8_4_ = fVar72 * local_2560._8_4_;
          auVar70._12_4_ = fVar73 * local_2560._12_4_;
          auVar70._16_4_ = fVar1 * 0.0;
          auVar70._20_4_ = fVar2 * 0.0;
          auVar70._24_4_ = fVar3 * 0.0;
          auVar70._28_4_ = 0;
          auVar8 = vminps_avx(auVar70,auVar63);
          auVar9 = vsubps_avx(auVar63,auVar60);
          auVar10 = vsubps_avx(auVar63,auVar8);
          local_2460 = vblendvps_avx(auVar8,auVar9,local_2660);
          local_2480 = vblendvps_avx(auVar60,auVar10,local_2660);
          local_2720 = auVar52._0_4_;
          fStack_271c = auVar52._4_4_;
          fStack_2718 = auVar52._8_4_;
          fStack_2714 = auVar52._12_4_;
          local_2740._0_4_ = auVar75._0_4_;
          local_2740._4_4_ = auVar75._4_4_;
          uStack_2738._0_4_ = auVar75._8_4_;
          uStack_2738._4_4_ = auVar75._12_4_;
          local_2420[0] = (float)local_2680._0_4_ * local_2720;
          local_2420[1] = (float)local_2680._4_4_ * fStack_271c;
          local_2420[2] = fStack_2678 * fStack_2718;
          local_2420[3] = fStack_2674 * fStack_2714;
          fStack_2410 = fStack_2670 * 0.0;
          fStack_240c = fStack_266c * 0.0;
          fStack_2408 = fStack_2668 * 0.0;
          uStack_2404 = local_2480._28_4_;
          local_2400[0] = (float)local_2680._0_4_ * (float)local_2740;
          local_2400[1] = (float)local_2680._4_4_ * local_2740._4_4_;
          local_2400[2] = fStack_2678 * (float)uStack_2738;
          local_2400[3] = fStack_2674 * uStack_2738._4_4_;
          fStack_23f0 = fStack_2670 * 0.0;
          fStack_23ec = fStack_266c * 0.0;
          fStack_23e8 = fStack_2668 * 0.0;
          uStack_23e4 = auVar60._28_4_;
          local_23e0[0] = (float)local_2680._0_4_ * fVar79;
          local_23e0[1] = (float)local_2680._4_4_ * fVar83;
          local_23e0[2] = fStack_2678 * fVar84;
          local_23e0[3] = fStack_2674 * fVar20;
          fStack_23d0 = fStack_2670 * 0.0;
          fStack_23cc = fStack_266c * 0.0;
          fStack_23c8 = fStack_2668 * 0.0;
          uStack_23c4 = auVar9._28_4_;
          auVar64._8_4_ = 0x7f800000;
          auVar64._0_8_ = 0x7f8000007f800000;
          auVar64._12_4_ = 0x7f800000;
          auVar64._16_4_ = 0x7f800000;
          auVar64._20_4_ = 0x7f800000;
          auVar64._24_4_ = 0x7f800000;
          auVar64._28_4_ = 0x7f800000;
          auVar86 = vblendvps_avx(auVar64,auVar24,auVar86);
          auVar60 = vshufps_avx(auVar86,auVar86,0xb1);
          auVar60 = vminps_avx(auVar86,auVar60);
          auVar8 = vshufpd_avx(auVar60,auVar60,5);
          auVar60 = vminps_avx(auVar60,auVar8);
          auVar8 = vpermpd_avx2(auVar60,0x4e);
          auVar60 = vminps_avx(auVar60,auVar8);
          auVar86 = vcmpps_avx(auVar86,auVar60,0);
          auVar59 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
          auVar51 = vpand_avx(auVar59,auVar51);
          auVar86 = vpmovzxwd_avx2(auVar51);
          auVar86 = vpslld_avx2(auVar86,0x1f);
          if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar86 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar86 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar86 >> 0x7f,0) == '\0') &&
                (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar86 >> 0xbf,0) == '\0') &&
              (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar86[0x1f]) {
            auVar86 = local_26a0;
          }
          uVar43 = vmovmskps_avx(auVar86);
          uVar33 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x80000000) {
            uVar33 = uVar33 + 1;
          }
          pRVar6 = (context->scene->geometries).items;
          uVar43 = *(uint *)(ray + k * 4 + 0x90);
          while( true ) {
            uVar34 = (ulong)uVar33;
            uVar33 = *(uint *)((long)&local_25a0 + uVar34 * 4);
            if (((pRVar6[uVar33].ptr)->mask & uVar43) != 0) break;
            *(undefined4 *)(local_26a0 + uVar34 * 4) = 0;
            if ((((((((local_26a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_26a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_26a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_26a0 >> 0x7f,0) == '\0') &&
                  (local_26a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_26a0 >> 0xbf,0) == '\0') &&
                (local_26a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_26a0[0x1f]) goto LAB_0166e505;
            auVar86 = vblendvps_avx(auVar64,auVar24,local_26a0);
            auVar60 = vshufps_avx(auVar86,auVar86,0xb1);
            auVar60 = vminps_avx(auVar86,auVar60);
            auVar8 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vminps_avx(auVar60,auVar8);
            auVar8 = vpermpd_avx2(auVar60,0x4e);
            auVar60 = vminps_avx(auVar60,auVar8);
            auVar60 = vcmpps_avx(auVar60,auVar86,0);
            auVar8 = local_26a0 & auVar60;
            auVar86 = local_26a0;
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar8 >> 0x7f,0) != '\0') ||
                  (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar8 >> 0xbf,0) != '\0') ||
                (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar8[0x1f] < '\0') {
              auVar86 = vandps_avx(auVar60,local_26a0);
            }
            uVar44 = vmovmskps_avx(auVar86);
            uVar33 = 0;
            for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x80000000) {
              uVar33 = uVar33 + 1;
            }
          }
          uVar4 = *(undefined4 *)(local_2480 + uVar34 * 4);
          uVar5 = *(undefined4 *)(local_2460 + uVar34 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar34 * 4);
          *(float *)(ray + k * 4 + 0xc0) = local_2420[uVar34];
          *(float *)(ray + k * 4 + 0xd0) = local_2400[uVar34];
          *(float *)(ray + k * 4 + 0xe0) = local_23e0[uVar34];
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25c0 + uVar34 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar33;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        }
      }
LAB_0166e505:
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }